

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

void __thiscall
CLI::ConversionError::ConversionError
          (ConversionError *this,string *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *results)

{
  size_type *psVar1;
  long *plVar2;
  undefined8 *puVar3;
  string *delim;
  pointer pcVar4;
  undefined8 uVar5;
  string local_c0;
  string *local_a0;
  long local_98;
  undefined1 local_90 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined1 local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  ::std::operator+(&local_40,"Could not convert: ",name);
  plVar2 = (long *)::std::__cxx11::string::append((char *)&local_40);
  delim = (string *)(plVar2 + 2);
  if ((string *)*plVar2 == delim) {
    local_90._0_8_ = (delim->_M_dataplus)._M_p;
    local_90._8_4_ = (undefined4)plVar2[3];
    local_90._12_4_ = *(undefined4 *)((long)plVar2 + 0x1c);
    local_a0 = (string *)local_90;
  }
  else {
    local_90._0_8_ = (delim->_M_dataplus)._M_p;
    local_a0 = (string *)*plVar2;
  }
  local_98 = plVar2[1];
  *plVar2 = (long)delim;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_60._0_8_ = (pointer)(local_60 + 0x10);
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_60,",","");
  detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((string *)(local_90 + 0x10),(detail *)results,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_60,delim);
  pcVar4 = (pointer)0xf;
  if (local_a0 != (string *)local_90) {
    pcVar4 = (pointer)local_90._0_8_;
  }
  if (pcVar4 < (pointer)(local_90._24_8_ + local_98)) {
    uVar5 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._16_8_ != &local_70) {
      uVar5 = local_70._M_allocated_capacity;
    }
    if ((pointer)(local_90._24_8_ + local_98) <= (ulong)uVar5) {
      puVar3 = (undefined8 *)
               ::std::__cxx11::string::replace
                         ((ulong)(local_90 + 0x10),0,(char *)0x0,(ulong)local_a0);
      goto LAB_00147ebc;
    }
  }
  puVar3 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_a0,local_90._16_8_);
LAB_00147ebc:
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  psVar1 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_c0.field_2._M_allocated_capacity = *psVar1;
    local_c0.field_2._8_8_ = puVar3[3];
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar1;
    local_c0._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_c0._M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  ConversionError(this,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._16_8_ != &local_70) {
    operator_delete((void *)local_90._16_8_,(ulong)(local_70._M_allocated_capacity + 1));
  }
  if ((pointer)local_60._0_8_ != (pointer)(local_60 + 0x10)) {
    operator_delete((void *)local_60._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_60._16_8_)->_M_p + 1));
  }
  if (local_a0 != (string *)local_90) {
    operator_delete(local_a0,(ulong)(local_90._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ConversionError(std::string name, std::vector<std::string> results)
        : ConversionError("Could not convert: " + name + " = " + detail::join(results)) {}